

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * testing::PrintToString<double>(double *value)

{
  string *in_RDI;
  stringstream ss;
  string *value_00;
  stringstream local_198 [408];
  
  value_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  internal::UniversalTersePrint<double>((double *)value_00,(ostream *)in_RDI);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return value_00;
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrint(value, &ss);
  return ss.str();
}